

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall
FxRuntimeStateIndex::Resolve(FxRuntimeStateIndex *this,FCompileContext *ctx)

{
  bool bVar1;
  BYTE BVar2;
  int iVar3;
  PString *pPVar4;
  PInt *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  FxIntCast *this_00;
  PClassActor *pPVar7;
  long *plVar8;
  FxExpression *pFVar9;
  char *message;
  FScriptPosition *other;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Index != (FxExpression *)0x0) {
    iVar6 = (*this->Index->_vptr_FxExpression[2])();
    pFVar9 = (FxExpression *)CONCAT44(extraout_var,iVar6);
    this->Index = pFVar9;
    if (pFVar9 != (FxExpression *)0x0) {
      iVar6 = (*(pFVar9->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
      if ((char)iVar6 == '\0') {
        message = "Numeric type expected";
      }
      else {
        iVar6 = (*this->Index->_vptr_FxExpression[3])();
        if ((char)iVar6 == '\0') {
          if (this->Index->ValueType->RegType != '\0') {
            this_00 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
            pFVar9 = this->Index;
            bVar1 = ctx->FromDecorate;
            (this_00->super_FxExpression)._vptr_FxExpression =
                 (_func_int **)&PTR__FxExpression_0070d370;
            FScriptPosition::FScriptPosition
                      (&(this_00->super_FxExpression).ScriptPosition,&pFVar9->ScriptPosition);
            (this_00->super_FxExpression).isresolved = false;
            (this_00->super_FxExpression).NeedResult = true;
            (this_00->super_FxExpression).ExprType = EFX_IntCast;
            (this_00->super_FxExpression)._vptr_FxExpression =
                 (_func_int **)&PTR__FxIntCast_0070b5b0;
            this_00->basex = pFVar9;
            (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
            this_00->NoWarn = bVar1;
            this_00->Explicit = false;
            this->Index = (FxExpression *)this_00;
            pFVar9 = FxIntCast::Resolve(this_00,ctx);
            this->Index = pFVar9;
            if (pFVar9 == (FxExpression *)0x0) goto LAB_005399b0;
          }
          pPVar7 = dyn_cast<PClassActor>((DObject *)ctx->Class);
          if ((pPVar7 != (PClassActor *)0x0) && (0 < pPVar7->NumOwnedStates)) {
            iVar6 = FStateLabelStorage::AddPointer
                              (&StateLabels,pPVar7->OwnedStates + ctx->StateIndex);
            this->symlabel = iVar6;
            (this->super_FxExpression).ValueType = (PType *)TypeStateLabel;
            return &this->super_FxExpression;
          }
          __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x2640,
                        "virtual FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &)");
        }
        pPVar4 = (PString *)this->Index[1]._vptr_FxExpression;
        other = &this->Index[1].ScriptPosition;
        if (pPVar4 == TypeString) {
          FString::AttachToOther(&local_30,&other->FileName);
        }
        else {
          local_30.Chars = (other->FileName).Chars;
        }
        BVar2 = (pPVar4->super_PBasicType).super_PType.RegType;
        if (BVar2 == '\x01') {
          iVar6 = (int)(double)local_30.Chars;
        }
        else {
          iVar6 = 0;
          if (BVar2 == '\0') {
            iVar6 = (int)local_30.Chars;
          }
        }
        if (pPVar4 == TypeString) {
          FString::~FString(&local_30);
        }
        if (-1 < iVar6) {
          if (iVar6 != 0) {
            plVar8 = (long *)FMemArena::Alloc(&FxAlloc,0x30);
            iVar3 = ctx->StateIndex;
            *plVar8 = (long)&PTR__FxExpression_0070d370;
            FScriptPosition::FScriptPosition
                      ((FScriptPosition *)(plVar8 + 1),&(this->super_FxExpression).ScriptPosition);
            plVar8[3] = 0;
            *(undefined2 *)(plVar8 + 4) = 0x100;
            *(undefined4 *)((long)plVar8 + 0x24) = 0x36;
            *plVar8 = (long)&PTR__FxExpression_0070d688;
            *(int *)(plVar8 + 5) = iVar6 + iVar3;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            pFVar9 = (FxExpression *)(**(code **)(*plVar8 + 0x10))(plVar8,ctx);
            return pFVar9;
          }
          if (ctx->FromDecorate != false) {
            pFVar9 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
            pFVar9->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
            FScriptPosition::FScriptPosition
                      (&pFVar9->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
            pFVar9->NeedResult = true;
            pFVar9->ExprType = EFX_Constant;
            pFVar9->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
            pPVar5 = TypeSInt32;
            pFVar9[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
            pFVar9->ValueType = (PType *)pPVar5;
            *(undefined4 *)&pFVar9[1].ScriptPosition.FileName.Chars = 0;
            pFVar9->isresolved = true;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            pFVar9->ValueType = (PType *)TypeStateLabel;
            return pFVar9;
          }
        }
        message = "State index must be positive";
      }
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message);
    }
  }
LAB_005399b0:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Index, ctx);

	if (!Index->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (Index->isConstant())
	{
		int index = static_cast<FxConstant *>(Index)->GetValue().GetInt();
		if (index < 0 || (index == 0 && !ctx.FromDecorate))
		{
			ScriptPosition.Message(MSG_ERROR, "State index must be positive");
			delete this;
			return nullptr;
		}
		else if (index == 0)
		{
			int symlabel = StateLabels.AddPointer(nullptr);
			auto x = new FxConstant(symlabel, ScriptPosition);
			delete this;
			x->ValueType = TypeStateLabel;
			return x;
		}
		else
		{
			auto x = new FxStateByIndex(ctx.StateIndex + index, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}
	else if (Index->ValueType->GetRegType() != REGT_INT)
	{ // Float.
		Index = new FxIntCast(Index, ctx.FromDecorate);
		SAFE_RESOLVE(Index, ctx);
	}
	auto aclass = dyn_cast<PClassActor>(ctx.Class);
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);
	symlabel = StateLabels.AddPointer(aclass->OwnedStates + ctx.StateIndex);
	ValueType = TypeStateLabel;
	return this;
}